

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

uint __thiscall
BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
          (BTree<EntryBTree,EntryKey> *this,EntryUnpacker *traverseFunctor)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint8_t *puVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  undefined2 *puVar9;
  uint uVar10;
  uint uVar11;
  EntryKey key;
  uint local_58;
  ushort local_50;
  KeyType local_40;
  
  local_58 = 0;
  uVar2 = swap_bytes(*(undefined2 *)(*(long *)this + 4));
  puVar9 = (undefined2 *)(*(long *)this + 6);
  uVar4 = 0;
LAB_0011cf7b:
  if (uVar4 != uVar2) {
    uVar3 = swap_bytes(*puVar9);
    uVar7 = 0;
    uVar10 = uVar3 >> 4 & 0x7ff;
    uVar6 = swap_bytes(*(undefined2 *)((long)puVar9 + (ulong)(uVar10 * 0xc + 0xc >> 3)));
    local_50 = uVar6 >> ((byte)uVar3 >> 2 & 4) & 0xfff;
    do {
      uVar11 = uVar7 * 0xc;
      iVar8 = uVar7 * 4;
      while( true ) {
        uVar11 = uVar11 + 0xc;
        if (uVar10 <= uVar7) {
          puVar9 = (undefined2 *)((long)puVar9 + (ulong)local_50);
          uVar4 = uVar4 + 1;
          goto LAB_0011cf7b;
        }
        uVar3 = swap_bytes(*(undefined2 *)((long)puVar9 + (ulong)(uVar11 >> 3)));
        local_40.m_flags = 0;
        local_40.m_nameIndex = 0xffffffff;
        local_40.m_extIndex = 0xffffffff;
        local_40.m_linkIndex = 0xffffffff;
        puVar5 = EntryBTree::parseData
                           ((EntryBTree *)this,&local_40,
                            (uint8_t *)((ulong)(uVar3 >> ((byte)iVar8 & 4) & 0xfff) + (long)puVar9))
        ;
        if (puVar5 != (uint8_t *)0x0) break;
        iVar8 = iVar8 + 4;
        uVar7 = uVar7 + 1;
      }
      local_58 = local_58 + 1;
      bVar1 = EntryUnpacker::operator()(traverseFunctor,&local_40);
      uVar7 = uVar7 + 1;
    } while (bVar1);
  }
  return local_58;
}

Assistant:

unsigned int traverse(TraverseFunctor& traverseFunctor) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		auto visitedKeyCount = 0u;
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);
			
			for (auto j = 0u; j < high; ++j) {
				const auto offset = getBitsAt(p, j + 1);
				const auto data = advancePointer(p, offset);
				
				Key key;
				if (self.parseData(key, data)) {
					++visitedKeyCount;
					if (!traverseFunctor(key))
						goto done;
				}
			}
			
			p = advancePointer(p, nextOffset);
		}
		
	done:
		return visitedKeyCount;
	}